

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llist.c
# Opt level: O0

void Curl_llist_remove(curl_llist *list,curl_llist_element *e,void *user)

{
  void *pvVar1;
  void *ptr;
  void *user_local;
  curl_llist_element *e_local;
  curl_llist *list_local;
  
  if ((e != (curl_llist_element *)0x0) && (list->size != 0)) {
    if (e == list->head) {
      list->head = e->next;
      if (list->head == (curl_llist_element *)0x0) {
        list->tail = (curl_llist_element *)0x0;
      }
      else {
        e->next->prev = (curl_llist_element *)0x0;
      }
    }
    else {
      if (e->prev == (curl_llist_element *)0x0) {
        list->head = e->next;
      }
      else {
        e->prev->next = e->next;
      }
      if (e->next == (curl_llist_element *)0x0) {
        list->tail = e->prev;
      }
      else {
        e->next->prev = e->prev;
      }
    }
    pvVar1 = e->ptr;
    e->ptr = (void *)0x0;
    e->prev = (curl_llist_element *)0x0;
    e->next = (curl_llist_element *)0x0;
    list->size = list->size - 1;
    if (list->dtor != (curl_llist_dtor)0x0) {
      (*list->dtor)(user,pvVar1);
    }
  }
  return;
}

Assistant:

void
Curl_llist_remove(struct curl_llist *list, struct curl_llist_element *e,
                  void *user)
{
  void *ptr;
  if(e == NULL || list->size == 0)
    return;

  if(e == list->head) {
    list->head = e->next;

    if(list->head == NULL)
      list->tail = NULL;
    else
      e->next->prev = NULL;
  }
  else {
    if(!e->prev)
      list->head = e->next;
    else
      e->prev->next = e->next;

    if(!e->next)
      list->tail = e->prev;
    else
      e->next->prev = e->prev;
  }

  ptr = e->ptr;

  e->ptr  = NULL;
  e->prev = NULL;
  e->next = NULL;

  --list->size;

  /* call the dtor() last for when it actually frees the 'e' memory itself */
  if(list->dtor)
    list->dtor(user, ptr);
}